

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::FillerParameter::SerializeWithCachedSizes(FillerParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  int size;
  int32 value;
  FillerParameter_VarianceNorm value_00;
  char *data;
  string *value_01;
  UnknownFieldSet *unknown_fields;
  float fVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FillerParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    type_abi_cxx11_(this);
    data = (char *)::std::__cxx11::string::data();
    type_abi_cxx11_(this);
    size = ::std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"caffe.FillerParameter.type");
    value_01 = type_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,value_01,output);
  }
  if ((uVar1 & 2) != 0) {
    fVar2 = FillerParameter::value(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar2,output);
  }
  if ((uVar1 & 4) != 0) {
    fVar2 = min(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar2,output);
  }
  if ((uVar1 & 0x40) != 0) {
    fVar2 = max(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar2,output);
  }
  if ((uVar1 & 8) != 0) {
    fVar2 = mean(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar2,output);
  }
  if ((uVar1 & 0x80) != 0) {
    fVar2 = std(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(6,fVar2,output);
  }
  if ((uVar1 & 0x20) != 0) {
    value = sparse(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(7,value,output);
  }
  if ((uVar1 & 0x10) != 0) {
    value_00 = variance_norm(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(8,value_00,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FillerParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void FillerParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.FillerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string type = 1 [default = "constant"];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.FillerParameter.type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->type(), output);
  }

  // optional float value = 2 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->value(), output);
  }

  // optional float min = 3 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->min(), output);
  }

  // optional float max = 4 [default = 1];
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->max(), output);
  }

  // optional float mean = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->mean(), output);
  }

  // optional float std = 6 [default = 1];
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(6, this->std(), output);
  }

  // optional int32 sparse = 7 [default = -1];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(7, this->sparse(), output);
  }

  // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      8, this->variance_norm(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.FillerParameter)
}